

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::StructDeclaration::isResolved(StructDeclaration *this)

{
  bool bVar1;
  Member *pMVar2;
  Expression *e;
  Member *m;
  Member *__end2;
  Member *__begin2;
  ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL> *__range2;
  ScopedResolver scopedResolver;
  StructDeclaration *this_local;
  
  if ((this->isBeingResolved & 1U) == 0) {
    scopedResolver.flag = (bool *)this;
    ScopedResolver::ScopedResolver((ScopedResolver *)&__range2,&this->isBeingResolved);
    __end2 = ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL>::begin
                       (&this->members);
    pMVar2 = ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL>::end(&this->members)
    ;
    for (; __end2 != pMVar2; __end2 = __end2 + 1) {
      e = pool_ref<soul::AST::Expression>::get(&__end2->type);
      bVar1 = isResolvedAsType(e);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_0038af20;
      }
    }
    this_local._7_1_ = true;
LAB_0038af20:
    ScopedResolver::~ScopedResolver((ScopedResolver *)&__range2);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool isResolved() const override
        {
            if (isBeingResolved)
                return false;

            ScopedResolver scopedResolver (isBeingResolved);

            for (auto& m : members)
                if (! isResolvedAsType (m.type.get()))
                    return false;

            return true;
        }